

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::ClientWaitForeverTest::iterate(ClientWaitForeverTest *this)

{
  deUint32 dVar1;
  GLenum err;
  deBool dVar2;
  EGLSyncKHR pvVar3;
  MessageBuilder *pMVar4;
  TestError *this_00;
  MessageBuilder local_648;
  int local_4c4;
  undefined1 local_4c0 [4];
  EGLint status;
  MessageBuilder local_340;
  uint local_1bc;
  char *pcStack_1b8;
  EGLBoolean ret;
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  Library *egl;
  ClientWaitForeverTest *this_local;
  
  egl = (Library *)this;
  log = (TestLog *)EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  local_20 = tcu::TestContext::getLog
                       ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  pvVar3 = (EGLSyncKHR)
           (*(code *)log->m_log[3].outputFile)
                     (log,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_syncType,0);
  (this->super_SyncTest).m_sync = pvVar3;
  tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1a0,&(this->super_SyncTest).m_sync);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [21])" = eglCreateSyncKHR(");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_eglDisplay);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
  pcStack_1b8 = getSyncTypeName((this->super_SyncTest).m_syncType);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&stack0xfffffffffffffe48);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [8])0x2c663b5);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  dVar1 = (*(code *)log->m_log[6].lock)();
  eglu::checkError(dVar1,"eglCreateSyncKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x1f6);
  if ((this->super_SyncTest).m_syncType == 0x30fa) {
    local_1bc = (*(code *)log->m_log[9].outputFile)
                          (log,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_sync,
                           0x30f2);
    tcu::TestLog::operator<<(&local_340,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_340,&local_1bc);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [21])" = eglSignalSyncKHR(");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_eglDisplay);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_sync);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [20])", EGL_SIGNALED_KHR)");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_340);
    dVar1 = (*(code *)log->m_log[6].lock)();
    eglu::checkError(dVar1,"eglSignalSyncKHR()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                     ,0x1fc);
  }
  else if ((this->super_SyncTest).m_syncType == 0x30f9) {
    do {
      (*(this->super_SyncTest).m_gl.flush)();
      err = (*(this->super_SyncTest).m_gl.getError)();
      glu::checkError(err,"flush()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                      ,0x200);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_4c0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_4c0,(char (*) [10])0x2b4b1e5);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_4c0);
  }
  local_4c4 = (**(code **)&log->m_log->isSessionOpen)
                        (log,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_sync,0,
                         0xffffffffffffffff);
  tcu::TestLog::operator<<(&local_648,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_648,&local_4c4);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [25])" = eglClientWaitSyncKHR(");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_eglDisplay);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_sync);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [22])0x2b4e1ef);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_648);
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 && (local_4c4 == 0x30f6))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      dVar1 = (*(code *)log->m_log[6].lock)();
      eglu::checkError(dVar1,"eglClientWaitSyncKHR()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                       ,0x20a);
      tcu::TestContext::setTestResult
                ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"status == EGL_CONDITION_SATISFIED_KHR",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
             ,0x209);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult	iterate					(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, NULL);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", NULL)" << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "eglCreateSyncKHR()");

		if (m_syncType == EGL_SYNC_REUSABLE_KHR)
		{
			EGLBoolean ret = egl.signalSyncKHR(m_eglDisplay, m_sync, EGL_SIGNALED_KHR);
			log << TestLog::Message << ret << " = eglSignalSyncKHR(" << m_eglDisplay << ", " << m_sync << ", EGL_SIGNALED_KHR)" << TestLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglSignalSyncKHR()");
		}
		else if (m_syncType == EGL_SYNC_FENCE_KHR)
		{
			GLU_CHECK_GLW_CALL(m_gl, flush());
			log << TestLog::Message << "glFlush()" << TestLog::EndMessage;
		}
		else
			DE_ASSERT(DE_FALSE);

		EGLint status = egl.clientWaitSyncKHR(m_eglDisplay, m_sync, 0, EGL_FOREVER_KHR);
		log << TestLog::Message << status << " = eglClientWaitSyncKHR(" << m_eglDisplay << ", " << m_sync << ", 0, EGL_FOREVER_KHR)" << TestLog::EndMessage;

		TCU_CHECK(status == EGL_CONDITION_SATISFIED_KHR);
		EGLU_CHECK_MSG(egl, "eglClientWaitSyncKHR()");

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}